

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O1

void __thiscall
Js::DynamicObject::InitSlots
          (DynamicObject *this,DynamicObject *instance,ScriptContext *scriptContext)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  DynamicTypeHandler *pDVar5;
  Recycler *pRVar6;
  undefined4 *puVar7;
  WriteBarrierPtr<void> *__s;
  size_t sVar8;
  size_t size;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  pRVar6 = scriptContext->recycler;
  pDVar5 = GetTypeHandler(this);
  iVar1 = pDVar5->slotCapacity;
  pDVar5 = GetTypeHandler(this);
  if ((int)(uint)pDVar5->inlineSlotCapacity < iVar1) {
    sVar8 = (long)iVar1 - (ulong)pDVar5->inlineSlotCapacity;
    local_58 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_9b2e095;
    data.filename._0_4_ = 0xd4;
    data.plusSize = sVar8;
    pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,(TrackAllocData *)local_58);
    size = 0xffffffffffffffff;
    if (-1 < (int)sVar8) {
      size = sVar8 * 8;
    }
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00dc2e7c;
      *puVar7 = 0;
    }
    if (size == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fc,"(byteSize != 0 || !TAllocator::FakeZeroLengthArray)",
                                  "byteSize != 0 || !TAllocator::FakeZeroLengthArray");
      if (!bVar3) goto LAB_00dc2e7c;
      *puVar7 = 0;
    }
    __s = (WriteBarrierPtr<void> *)
          Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>(pRVar6,size);
    if (__s == (WriteBarrierPtr<void> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00dc2e7c:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    memset(__s,0,sVar8 * 8);
    Memory::Recycler::WBSetBit((char *)&instance->auxSlots);
    (instance->auxSlots).ptr = __s;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&instance->auxSlots);
  }
  return;
}

Assistant:

void DynamicObject::InitSlots(DynamicObject * instance, ScriptContext * scriptContext)
    {
        Recycler * recycler = scriptContext->GetRecycler();
        int slotCapacity = GetTypeHandler()->GetSlotCapacity();
        int inlineSlotCapacity = GetTypeHandler()->GetInlineSlotCapacity();
        if (slotCapacity > inlineSlotCapacity)
        {
            instance->auxSlots = RecyclerNewArrayZ(recycler, Field(Var), slotCapacity - inlineSlotCapacity);
        }
    }